

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkShaderModuleCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkShaderModuleCreateInfo>
          (Impl *this,VkShaderModuleCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkShaderModuleCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkShaderModuleCreateInfo>(alloc,count);
    if (pVVar1 != (VkShaderModuleCreateInfo *)0x0) {
      pVVar1 = (VkShaderModuleCreateInfo *)memmove(pVVar1,src,count * 0x28);
      return pVVar1;
    }
  }
  return (VkShaderModuleCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}